

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O0

int __thiscall deqp::egl::ResizeTest::init(ResizeTest *this,EVP_PKEY_CTX *ctx)

{
  EglTestContext *this_00;
  EGLenum surfaceType;
  deUint32 dVar1;
  int iVar2;
  int height_;
  ApiType apiType;
  int extraout_EAX;
  Library *egl_00;
  CommandLine *commandLine;
  NativeDisplay *pNVar3;
  EGLDisplay eglDisplay_00;
  undefined4 extraout_var;
  UniqueContext *this_01;
  NativeDisplayFactory *factory;
  NativeWindowFactory *pNVar4;
  NativeWindow *window;
  UniqueSurface *this_02;
  MessageBuilder *pMVar5;
  MessageBuilder local_248;
  DefaultDeleter<eglu::UniqueSurface> local_c1;
  undefined1 local_c0 [8];
  MovePtr<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_> surface;
  EGLSurface eglSurface;
  undefined1 local_a0 [8];
  MovePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> nativeWindow;
  WindowParams windowParams;
  NativeWindowFactory *windowFactory;
  NativeDisplay *nativeDisplay;
  Visibility visibility;
  EGLint configId;
  undefined1 local_58 [8];
  MovePtr<eglu::UniqueContext,_de::DefaultDeleter<eglu::UniqueContext>_> context;
  EGLContext eglContext;
  EGLint ctxAttribs [3];
  EGLConfig eglConfig;
  EGLDisplay eglDisplay;
  CommandLine *cmdLine;
  Library *egl;
  ResizeTest *this_local;
  
  tcu::TestNode::init((TestNode *)this,ctx);
  egl_00 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  commandLine = tcu::TestContext::getCommandLine
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pNVar3 = EglTestContext::getNativeDisplay((this->super_TestCase).m_eglTestCtx);
  eglDisplay_00 = eglu::getAndInitDisplay(pNVar3,(Version *)0x0);
  surfaceType = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])();
  register0x00000000 = getEGLConfig(egl_00,eglDisplay_00,surfaceType);
  eglContext = (EGLContext)0x200003098;
  ctxAttribs[0] = 0x3038;
  context.super_UniqueBase<eglu::UniqueContext,_de::DefaultDeleter<eglu::UniqueContext>_>.m_data.
  _8_4_ = (*egl_00->_vptr_Library[6])(egl_00,eglDisplay_00,register0x00000000,0,&eglContext);
  context.super_UniqueBase<eglu::UniqueContext,_de::DefaultDeleter<eglu::UniqueContext>_>.m_data.
  _12_4_ = extraout_var;
  dVar1 = (*egl_00->_vptr_Library[0x1f])();
  eglu::checkError(dVar1,"eglCreateContext()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglResizeTests.cpp"
                   ,0x9e);
  this_01 = (UniqueContext *)operator_new(0x18);
  eglu::UniqueContext::UniqueContext
            (this_01,egl_00,eglDisplay_00,
             (EGLContext)
             context.super_UniqueBase<eglu::UniqueContext,_de::DefaultDeleter<eglu::UniqueContext>_>
             .m_data._8_8_);
  de::DefaultDeleter<eglu::UniqueContext>::DefaultDeleter
            ((DefaultDeleter<eglu::UniqueContext> *)((long)&visibility + 3));
  de::details::MovePtr<eglu::UniqueContext,_de::DefaultDeleter<eglu::UniqueContext>_>::MovePtr
            ((MovePtr<eglu::UniqueContext,_de::DefaultDeleter<eglu::UniqueContext>_> *)local_58,
             this_01);
  nativeDisplay._4_4_ =
       eglu::getConfigAttribInt(egl_00,eglDisplay_00,stack0xffffffffffffffd0,0x3028);
  nativeDisplay._0_4_ = eglu::parseWindowVisibility(commandLine);
  pNVar3 = EglTestContext::getNativeDisplay((this->super_TestCase).m_eglTestCtx);
  factory = EglTestContext::getNativeDisplayFactory((this->super_TestCase).m_eglTestCtx);
  pNVar4 = eglu::selectNativeWindowFactory(factory,commandLine);
  iVar2 = tcu::Vector<int,_2>::x(&this->m_oldSize);
  height_ = tcu::Vector<int,_2>::y(&this->m_oldSize);
  eglu::WindowParams::WindowParams
            ((WindowParams *)
             &nativeWindow.
              super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.m_data.
              field_0xc,iVar2,height_,(Visibility)nativeDisplay);
  iVar2 = (*(pNVar4->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                    (pNVar4,pNVar3,eglDisplay_00,stack0xffffffffffffffd0,0,
                     &nativeWindow.
                      super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.
                      m_data.field_0xc);
  de::DefaultDeleter<eglu::NativeWindow>::DefaultDeleter
            ((DefaultDeleter<eglu::NativeWindow> *)((long)&eglSurface + 7));
  de::details::MovePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::MovePtr
            ((MovePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> *)local_a0,iVar2)
  ;
  window = de::details::UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::
           operator*((UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> *)
                     local_a0);
  surface.super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>.m_data.
  _8_8_ = eglu::createWindowSurface
                    (pNVar3,window,eglDisplay_00,stack0xffffffffffffffd0,(EGLAttrib *)0x0);
  this_02 = (UniqueSurface *)operator_new(0x18);
  eglu::UniqueSurface::UniqueSurface
            (this_02,egl_00,eglDisplay_00,
             (EGLSurface)
             surface.super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>
             .m_data._8_8_);
  de::DefaultDeleter<eglu::UniqueSurface>::DefaultDeleter(&local_c1);
  de::details::MovePtr<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>::MovePtr
            ((MovePtr<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_> *)local_c0,
             this_02);
  tcu::TestLog::operator<<(&local_248,this->m_log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<(&local_248,(char (*) [25])"Chose EGLConfig with id ");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)((long)&nativeDisplay + 4));
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2c7b265);
  pMVar5 = tcu::MessageBuilder::operator<<
                     (pMVar5,(char (*) [35])"Created initial surface with size ");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&this->m_oldSize);
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_248);
  this_00 = (this->super_TestCase).m_eglTestCtx;
  apiType = glu::ApiType::es(2,0);
  EglTestContext::initGLFunctions(this_00,&this->m_gl,apiType);
  this->m_config = stack0xffffffffffffffd0;
  de::details::MovePtr<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>::operator=
            (&this->m_surface,
             (MovePtr<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_> *)local_c0);
  de::details::MovePtr<eglu::UniqueContext,_de::DefaultDeleter<eglu::UniqueContext>_>::operator=
            (&this->m_context,
             (MovePtr<eglu::UniqueContext,_de::DefaultDeleter<eglu::UniqueContext>_> *)local_58);
  this->m_display = eglDisplay_00;
  de::details::MovePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::operator=
            (&this->m_nativeWindow,
             (MovePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> *)local_a0);
  dVar1 = (*egl_00->_vptr_Library[0x1f])();
  eglu::checkError(dVar1,"init",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglResizeTests.cpp"
                   ,0xc1);
  de::details::MovePtr<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>::~MovePtr
            ((MovePtr<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_> *)local_c0);
  de::details::MovePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::~MovePtr
            ((MovePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> *)local_a0);
  de::details::MovePtr<eglu::UniqueContext,_de::DefaultDeleter<eglu::UniqueContext>_>::~MovePtr
            ((MovePtr<eglu::UniqueContext,_de::DefaultDeleter<eglu::UniqueContext>_> *)local_58);
  return extraout_EAX;
}

Assistant:

void ResizeTest::init (void)
{
	TestCase::init();

	const Library&				egl				= m_eglTestCtx.getLibrary();
	const CommandLine&			cmdLine			= m_testCtx.getCommandLine();
	const EGLDisplay			eglDisplay		= eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());
	const EGLConfig				eglConfig		= getEGLConfig(egl, eglDisplay, surfaceType());
	const EGLint				ctxAttribs[]	=
	{
		EGL_CONTEXT_CLIENT_VERSION, 2,
		EGL_NONE
	};
	EGLContext					eglContext		= egl.createContext(eglDisplay,
																   eglConfig,
																   EGL_NO_CONTEXT,
																   ctxAttribs);
	EGLU_CHECK_MSG(egl, "eglCreateContext()");
	MovePtr<UniqueContext>		context			(new UniqueContext(egl, eglDisplay, eglContext));
	const EGLint				configId		= eglu::getConfigAttribInt(egl,
																		   eglDisplay,
																		   eglConfig,
																		   EGL_CONFIG_ID);
	const Visibility			visibility		= eglu::parseWindowVisibility(cmdLine);
	NativeDisplay&				nativeDisplay	= m_eglTestCtx.getNativeDisplay();
	const NativeWindowFactory&	windowFactory	= eglu::selectNativeWindowFactory(m_eglTestCtx.getNativeDisplayFactory(),
																				  cmdLine);

	const WindowParams			windowParams	(m_oldSize.x(), m_oldSize.y(), visibility);
	MovePtr<NativeWindow>		nativeWindow	(windowFactory.createWindow(&nativeDisplay,
																			 eglDisplay,
																			 eglConfig,
																			 DE_NULL,
																			 windowParams));
	const EGLSurface			eglSurface		= eglu::createWindowSurface(nativeDisplay,
																			*nativeWindow,
																			eglDisplay,
																			eglConfig,
																			DE_NULL);
	MovePtr<UniqueSurface>		surface			(new UniqueSurface(egl, eglDisplay, eglSurface));

	m_log << TestLog::Message
		  << "Chose EGLConfig with id " << configId << ".\n"
		  << "Created initial surface with size " << m_oldSize
		  << TestLog::EndMessage;

	m_eglTestCtx.initGLFunctions(&m_gl, glu::ApiType::es(2, 0));
	m_config		= eglConfig;
	m_surface		= surface;
	m_context		= context;
	m_display		= eglDisplay;
	m_nativeWindow	= nativeWindow;
	EGLU_CHECK_MSG(egl, "init");
}